

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

void Io_WriteHie(Abc_Ntk_t *pNtk,char *pBaseName,char *pFileName)

{
  uint uVar1;
  Abc_NtkFunc_t AVar2;
  Io_FileType_t IVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtkH;
  Abc_Ntk_t *pAVar6;
  Abc_Des_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  char *__format;
  long lVar9;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,_stdout);
    return;
  }
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                  ,0x1ef,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
  }
  IVar3 = Io_ReadFileType(pBaseName);
  if (IVar3 == IO_FILE_BLIF) {
    iVar4 = 0;
LAB_0033810a:
    pAVar5 = Io_ReadBlifMv(pBaseName,iVar4,1);
  }
  else {
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 == IO_FILE_BLIFMV) {
      iVar4 = 1;
      goto LAB_0033810a;
    }
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 != IO_FILE_VERILOG) {
      Io_WriteHie_cold_1();
      return;
    }
    pAVar5 = Io_ReadVerilog(pBaseName,1);
  }
  if (pAVar5 == (Abc_Ntk_t *)0x0) {
    return;
  }
  pNtkH = pAVar5;
  if ((0 < pAVar5->nObjCounts[9]) && (pNtk->nBarBufs == 0)) {
    pNtkH = Abc_NtkFlattenLogicHierarchy(pAVar5);
    Abc_NtkDelete(pAVar5);
    if (pNtkH == (Abc_Ntk_t *)0x0) {
      return;
    }
  }
  if (pNtk->nBarBufs < 1) {
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 == IO_FILE_BLIFMV) {
      if (0 < pNtkH->nObjCounts[10]) {
        puts("Hierarchy writer does not support BLIF-MV with blackboxes.");
        goto LAB_003383fa;
      }
      if (pNtk->ntkType == ABC_NTK_NETLIST) {
        __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                      ,0x217,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
      }
      pAVar6 = Abc_NtkToNetlist(pNtk);
      iVar4 = Abc_NtkConvertToBlifMv(pAVar6);
      if (iVar4 == 0) goto LAB_003383fa;
      pAVar5 = Abc_NtkInsertBlifMv(pNtkH,pAVar6);
      Abc_NtkDelete(pAVar6);
    }
    else {
      if (0 < pNtkH->nObjCounts[10]) {
        pAVar6 = Abc_NtkToNetlist(pNtk);
        pAVar5 = Abc_NtkInsertNewLogic(pNtkH,pAVar6);
        Abc_NtkDelete(pAVar6);
        if (pAVar5 == (Abc_Ntk_t *)0x0) goto LAB_003383fa;
        uVar1 = pNtkH->nObjCounts[10];
        __format = "Hierarchy writer reintroduced %d instances of blackboxes.\n";
        goto LAB_003381b9;
      }
      puts("Warning: The output network does not contain blackboxes.");
      pAVar5 = Abc_NtkToNetlist(pNtk);
    }
    Abc_NtkDelete(pNtkH);
    pNtkH = pAVar5;
    if (pAVar5 == (Abc_Ntk_t *)0x0) {
      return;
    }
  }
  else {
    pAVar6 = Abc_NtkToNetlist(pNtk);
    pAVar5 = Abc_NtkFromBarBufs(pNtkH,pAVar6);
    Abc_NtkDelete(pAVar6);
    if (pAVar5 == (Abc_Ntk_t *)0x0) goto LAB_003383fa;
    uVar1 = pNtk->nBarBufs;
    __format = "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n";
LAB_003381b9:
    printf(__format,(ulong)uVar1);
    Abc_NtkDelete(pNtkH);
    pNtkH = pAVar5;
  }
  IVar3 = Io_ReadFileType(pFileName);
  if (IVar3 == IO_FILE_BLIF) {
    pAVar7 = pNtkH->pDesign;
    if (pAVar7 == (Abc_Des_t *)0x0) {
      if ((pNtkH->ntkFunc != ABC_FUNC_SOP) && (pNtkH->ntkFunc != ABC_FUNC_MAP)) {
        Abc_NtkToSop(pNtkH,-1,1000000000);
      }
    }
    else {
      pVVar8 = pAVar7->vModules;
      if (0 < pVVar8->nSize) {
        lVar9 = 0;
        do {
          AVar2 = ((Abc_Ntk_t *)pVVar8->pArray[lVar9])->ntkFunc;
          if ((AVar2 != ABC_FUNC_SOP) && (AVar2 != ABC_FUNC_MAP)) {
            Abc_NtkToSop((Abc_Ntk_t *)pVVar8->pArray[lVar9],-1,1000000000);
            pAVar7 = pNtkH->pDesign;
          }
          lVar9 = lVar9 + 1;
          pVVar8 = pAVar7->vModules;
        } while (lVar9 < pVVar8->nSize);
      }
    }
    Io_WriteBlif(pNtkH,pFileName,1,0,0);
  }
  else {
    IVar3 = Io_ReadFileType(pFileName);
    if (IVar3 == IO_FILE_VERILOG) {
      pAVar7 = pNtkH->pDesign;
      if (pAVar7 == (Abc_Des_t *)0x0) {
        if (1 < pNtkH->ntkFunc - ABC_FUNC_AIG) {
          Abc_NtkToAig(pNtkH);
        }
      }
      else {
        pVVar8 = pAVar7->vModules;
        if (0 < pVVar8->nSize) {
          lVar9 = 0;
          do {
            if (1 < ((Abc_Ntk_t *)pVVar8->pArray[lVar9])->ntkFunc - ABC_FUNC_AIG) {
              Abc_NtkToAig((Abc_Ntk_t *)pVVar8->pArray[lVar9]);
              pAVar7 = pNtkH->pDesign;
            }
            lVar9 = lVar9 + 1;
            pVVar8 = pAVar7->vModules;
          } while (lVar9 < pVVar8->nSize);
        }
      }
      Io_WriteVerilog(pNtkH,pFileName,0);
    }
    else {
      IVar3 = Io_ReadFileType(pFileName);
      if (IVar3 == IO_FILE_BLIFMV) {
        Io_WriteBlifMv(pNtkH,pFileName);
      }
      else {
        Io_WriteHie_cold_2();
      }
    }
  }
LAB_003383fa:
  Abc_NtkDelete(pNtkH);
  return;
}

Assistant:

void Io_WriteHie( Abc_Ntk_t * pNtk, char * pBaseName, char * pFileName )
{
    Abc_Ntk_t * pNtkTemp, * pNtkResult, * pNtkBase = NULL;
    int i;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }

    // read the base network
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIF )
        pNtkBase = Io_ReadBlifMv( pBaseName, 0, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV )
        pNtkBase = Io_ReadBlifMv( pBaseName, 1, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_VERILOG )
        pNtkBase = Io_ReadVerilog( pBaseName, 1 );
    else 
        fprintf( stderr, "Unknown input file format.\n" );
    if ( pNtkBase == NULL )
        return;

    // flatten logic hierarchy if present
    if ( Abc_NtkWhiteboxNum(pNtkBase) > 0 && pNtk->nBarBufs == 0 )
    {
        pNtkBase = Abc_NtkFlattenLogicHierarchy( pNtkTemp = pNtkBase );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkBase == NULL )
            return;
    }

    // reintroduce the boxes into the netlist
    if ( pNtk->nBarBufs > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkFromBarBufs( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n", pNtk->nBarBufs );
    }
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV ) 
    {
        if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
        {
            printf( "Hierarchy writer does not support BLIF-MV with blackboxes.\n" );
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // convert the current network to BLIF-MV
        assert( !Abc_NtkIsNetlist(pNtk) );
        pNtkResult = Abc_NtkToNetlist( pNtk );
        if ( !Abc_NtkConvertToBlifMv( pNtkResult ) )
        {
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // reintroduce the network
        pNtkResult = Abc_NtkInsertBlifMv( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
    }
    else if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkInsertNewLogic( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer reintroduced %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtkBase) );
    }
    else
    {
        printf( "Warning: The output network does not contain blackboxes.\n" );
        pNtkResult = Abc_NtkToNetlist( pNtk );
    }
    Abc_NtkDelete( pNtkBase );
    if ( pNtkResult == NULL )
        return;

    // write the resulting network
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIF )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        }
        else
        {
            if ( !Abc_NtkHasSop(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToSop( pNtkResult, -1, ABC_INFINITY );
        }
        Io_WriteBlif( pNtkResult, pFileName, 1, 0, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_VERILOG )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToAig( pNtkTemp );
        }
        else
        {
            if ( !Abc_NtkHasAig(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToAig( pNtkResult );
        }
        Io_WriteVerilog( pNtkResult, pFileName, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtkResult, pFileName );
    }
    else 
        fprintf( stderr, "Unknown output file format.\n" );

    Abc_NtkDelete( pNtkResult );
}